

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O1

void __thiscall CGameClient::OnDemoRecSnap(CGameClient *this)

{
  CClientData *pCVar1;
  undefined8 uVar2;
  uint *puVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar6;
  int iVar7;
  char (*pacVar8) [97];
  long lVar9;
  int p;
  uint uVar10;
  uint *puVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  CClientData *pCVar16;
  long in_FS_OFFSET;
  bool bVar17;
  char (*local_c8) [97];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  uint *puVar5;
  undefined4 extraout_var_01;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = this->m_aClients;
  pcVar14 = this->m_aClients[0].m_aClan;
  local_c8 = this->m_aClients[0].m_aaSkinPartNames;
  uVar15 = 0;
  bVar17 = false;
  pCVar16 = pCVar1;
  do {
    if (this->m_aClients[uVar15].m_Active == true) {
      iVar4 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x22])
                        (this->m_pClient,0xd,uVar15 & 0xffffffff,0xe8);
      puVar5 = (uint *)CONCAT44(extraout_var,iVar4);
      if (puVar5 == (uint *)0x0) {
        if (!bVar17) goto LAB_001860ba;
        break;
      }
      *puVar5 = (uint)(uVar15 == (uint)this->m_LocalClientID);
      puVar5[1] = pCVar1[uVar15].m_Team;
      iVar4 = 4;
      iVar7 = 0;
      puVar3 = puVar5 + 2;
      do {
        puVar11 = puVar3;
        local_b8 = local_b8 & 0xffffffff00000000;
        lVar12 = 0;
        do {
          if (pCVar16->m_aName[lVar12 + iVar7] == '\0') {
            iVar13 = iVar7 + (int)lVar12;
            break;
          }
          *(char *)((long)&local_b8 + lVar12) = pCVar16->m_aName[lVar12 + iVar7];
          lVar12 = lVar12 + 1;
          iVar13 = iVar7 + 4;
        } while (lVar12 != 4);
        iVar7 = iVar13;
        uVar10 = (uint)local_b8 ^ 0xffffff80;
        *puVar11 = (int)local_b8._3_1_ + 0x80U | local_b8._2_1_ * 0x100 + 0x8000U |
                   local_b8._1_1_ * 0x10000 + 0x800000U | uVar10 << 0x18;
        iVar4 = iVar4 + -1;
        puVar3 = puVar11 + 1;
      } while (iVar4 != 0);
      *(undefined1 *)puVar11 = 0;
      iVar4 = 3;
      iVar7 = 0;
      puVar3 = puVar5 + 6;
      do {
        puVar11 = puVar3;
        local_b8 = local_b8 & 0xffffffff00000000;
        lVar12 = 0;
        do {
          if (pcVar14[lVar12 + iVar7] == '\0') {
            iVar13 = iVar7 + (int)lVar12;
            break;
          }
          *(char *)((long)&local_b8 + lVar12) = pcVar14[lVar12 + iVar7];
          lVar12 = lVar12 + 1;
          iVar13 = iVar7 + 4;
        } while (lVar12 != 4);
        iVar7 = iVar13;
        uVar10 = (uint)local_b8 ^ 0xffffff80;
        *puVar11 = (int)local_b8._3_1_ + 0x80U | local_b8._2_1_ * 0x100 + 0x8000U |
                   local_b8._1_1_ * 0x10000 + 0x800000U | uVar10 << 0x18;
        iVar4 = iVar4 + -1;
        puVar3 = puVar11 + 1;
      } while (iVar4 != 0);
      *(undefined1 *)puVar11 = 0;
      puVar5[9] = pCVar1[uVar15].m_Country;
      lVar12 = 0;
      pacVar8 = local_c8;
      do {
        iVar7 = 6;
        puVar3 = puVar5 + lVar12 * 6 + 10;
        iVar4 = 0;
        do {
          puVar11 = puVar3;
          local_b8 = local_b8 & 0xffffffff00000000;
          iVar13 = iVar4 + 4;
          lVar9 = 0;
          do {
            if ((*pacVar8)[lVar9 + iVar4] == '\0') {
              iVar13 = iVar4 + (int)lVar9;
              break;
            }
            *(char *)((long)&local_b8 + lVar9) = (*pacVar8)[lVar9 + iVar4];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          uVar10 = (uint)local_b8 ^ 0xffffff80;
          *puVar11 = (int)local_b8._3_1_ + 0x80U | local_b8._2_1_ * 0x100 + 0x8000U |
                     local_b8._1_1_ * 0x10000 + 0x800000U | uVar10 << 0x18;
          iVar7 = iVar7 + -1;
          puVar3 = puVar11 + 1;
          iVar4 = iVar13;
        } while (iVar7 != 0);
        *(undefined1 *)puVar11 = 0;
        puVar5[lVar12 + 0x2e] = pCVar1[uVar15].m_aUseCustomColors[lVar12];
        puVar5[lVar12 + 0x34] = pCVar1[uVar15].m_aSkinPartColors[lVar12];
        lVar12 = lVar12 + 1;
        pacVar8 = pacVar8 + 1;
      } while (lVar12 != 6);
    }
    bVar17 = 0x3e < uVar15;
    uVar15 = uVar15 + 1;
    pCVar16 = pCVar16 + 1;
    pcVar14 = pcVar14 + 0x5b0;
    local_c8 = (char (*) [97])((long)(local_c8 + 0xf) + 1);
  } while (uVar15 != 0x40);
  local_b8 = 0xc8000003e8;
  uStack_b0 = 0x52800000032;
  local_a8 = 0x1f4000004b0;
  uStack_a0 = 0x5f00000096;
  local_98 = 0x1f4000009470;
  uStack_90 = 0x5dc0000012c;
  local_88 = 0xd6d800000032;
  uStack_80 = 0x8c00030d40;
  local_78 = 0x35b600000007d;
  uStack_70 = 0x7d000000c8;
  local_68 = 0x5000043238;
  uStack_60 = 0x2bc00000014;
  local_58 = 0xc8000186a0;
  uStack_50 = 0x3a9800013880;
  local_48 = 100;
  uStack_40 = 0x6400000064;
  iVar4 = mem_comp(&local_b8,&this->m_Tuning,0x80);
  if (iVar4 != 0) {
    iVar4 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x22])
                      (this->m_pClient,0xf,0,0x80);
    if ((void *)CONCAT44(extraout_var_00,iVar4) == (void *)0x0) goto LAB_001860ba;
    mem_copy((void *)CONCAT44(extraout_var_00,iVar4),&this->m_Tuning,0x80);
  }
  iVar4 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x22])(this->m_pClient,0xe,0,0x14);
  puVar6 = (undefined8 *)CONCAT44(extraout_var_01,iVar4);
  if (puVar6 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)&(this->m_GameInfo).m_TimeLimit;
    *puVar6 = *(undefined8 *)&this->m_GameInfo;
    puVar6[1] = uVar2;
    *(int *)(puVar6 + 2) = (this->m_GameInfo).m_MatchCurrent;
  }
LAB_001860ba:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameClient::OnDemoRecSnap()
{
	// add client info
	for(int i = 0; i < MAX_CLIENTS; ++i)
	{
		if(!m_aClients[i].m_Active)
			continue;

		CNetObj_De_ClientInfo *pClientInfo = static_cast<CNetObj_De_ClientInfo *>(Client()->SnapNewItem(NETOBJTYPE_DE_CLIENTINFO, i, sizeof(CNetObj_De_ClientInfo)));
		if(!pClientInfo)
			return;

		pClientInfo->m_Local = i==m_LocalClientID ? 1 : 0;
		pClientInfo->m_Team = m_aClients[i].m_Team;
		StrToInts(pClientInfo->m_aName, 4, m_aClients[i].m_aName);
		StrToInts(pClientInfo->m_aClan, 3, m_aClients[i].m_aClan);
		pClientInfo->m_Country = m_aClients[i].m_Country;

		for(int p = 0; p < NUM_SKINPARTS; p++)
		{
			StrToInts(pClientInfo->m_aaSkinPartNames[p], 6, m_aClients[i].m_aaSkinPartNames[p]);
			pClientInfo->m_aUseCustomColors[p] = m_aClients[i].m_aUseCustomColors[p];
			pClientInfo->m_aSkinPartColors[p] = m_aClients[i].m_aSkinPartColors[p];
		}
	}

	// add tuning
	CTuningParams StandardTuning;
	if(mem_comp(&StandardTuning, &m_Tuning, sizeof(CTuningParams)) != 0)
	{
		CNetObj_De_TuneParams *pTuneParams = static_cast<CNetObj_De_TuneParams *>(Client()->SnapNewItem(NETOBJTYPE_DE_TUNEPARAMS, 0, sizeof(CNetObj_De_TuneParams)));
		if(!pTuneParams)
			return;

		mem_copy(pTuneParams->m_aTuneParams, &m_Tuning, sizeof(pTuneParams->m_aTuneParams));
	}

	// add game info
	CNetObj_De_GameInfo *pGameInfo = static_cast<CNetObj_De_GameInfo *>(Client()->SnapNewItem(NETOBJTYPE_DE_GAMEINFO, 0, sizeof(CNetObj_De_GameInfo)));
	if(!pGameInfo)
		return;

	pGameInfo->m_GameFlags = m_GameInfo.m_GameFlags;
	pGameInfo->m_ScoreLimit = m_GameInfo.m_ScoreLimit;
	pGameInfo->m_TimeLimit = m_GameInfo.m_TimeLimit;
	pGameInfo->m_MatchNum = m_GameInfo.m_MatchNum;
	pGameInfo->m_MatchCurrent = m_GameInfo.m_MatchCurrent;
}